

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int vrf_part(part_t *part,int mode)

{
  char cVar1;
  char *pcVar2;
  
  tdefs[0].vtotal = tdefs[0].vtotal + part->partkey;
  cVar1 = part->name[0];
  if (cVar1 != '\0') {
    pcVar2 = part->name;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar1;
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  cVar1 = part->mfgr[0];
  if (cVar1 != '\0') {
    pcVar2 = part->mfgr;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar1;
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  cVar1 = part->brand[0];
  if (cVar1 != '\0') {
    pcVar2 = part->brand;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar1;
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  cVar1 = part->type[0];
  if (cVar1 != '\0') {
    pcVar2 = part->type;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar1;
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  tdefs[0].vtotal = tdefs[0].vtotal + part->size;
  cVar1 = part->container[0];
  if (cVar1 != '\0') {
    pcVar2 = part->container;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar1;
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  cVar1 = part->category[0];
  if (cVar1 != '\0') {
    pcVar2 = part->category;
    do {
      pcVar2 = pcVar2 + 1;
      tdefs[0].vtotal = tdefs[0].vtotal + (long)cVar1;
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
  }
  return 0;
}

Assistant:

int
vrf_part(part_t *part, int mode)
{

    UNUSED(mode);
    VRF_STRT(PART);
    VRF_INT(PART, part->partkey);
    VRF_STR(PART, part->name);
    VRF_STR(PART, part->mfgr);
    VRF_STR(PART, part->brand);
    VRF_STR(PART, part->type);
    VRF_INT(PART, part->size);
    VRF_STR(PART, part->container);
    VRF_STR(PART, part->category);
    VRF_END(PART);

    return(0);
}